

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.h
# Opt level: O2

void __thiscall caldate_t::julian_date(caldate_t *this,int *jy,int *jm,int *jd)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = julian_dayno(this);
  dVar3 = floor(dVar3 + 0.5);
  dVar4 = floor(((double)((int)dVar3 + 0x5f4) + -122.1) / 365.25);
  dVar5 = floor((double)(int)dVar4 * 365.25);
  iVar2 = ((int)dVar3 + 0x5f4) - (int)dVar5;
  dVar3 = floor((double)iVar2 / 30.6001);
  iVar1 = (-(uint)((int)dVar3 < 0xe) | 0xfffffff3) + (int)dVar3;
  *jm = iVar1;
  *jy = (2 < iVar1 ^ 0xffffed95) + (int)dVar4;
  dVar3 = floor((double)(int)dVar3 * 30.6001);
  *jd = iVar2 - (int)dVar3;
  return;
}

Assistant:

void julian_date(int &jy, int &jm, int &jd)
    {
        int32_t z = (int32_t)floor(julian_dayno() + 0.5);

        int32_t a = z;
        int32_t b = a + 1524;
        int32_t c = (int32_t)floor((b - 122.1) / 365.25);
        int32_t d = (int32_t)floor(365.25 * c);
        int32_t e = (int32_t)floor((b - d) / 30.6001);

        jm = e < 14 ? e - 1 : e - 13;
        jy = jm > 2 ? c - 4716 : c - 4715;
        jd = b - d - (int32_t)floor(30.6001 * e);
    }